

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O3

void __thiscall Cmd::editDeletePreviousWord(Cmd *this,State *state)

{
  pointer pcVar1;
  size_t sVar2;
  
  sVar2 = state->pos;
  if (sVar2 != 0) {
    pcVar1 = (state->buf)._M_dataplus._M_p;
    do {
      if (pcVar1[sVar2 - 1] != ' ') {
        pcVar1 = (state->buf)._M_dataplus._M_p;
        goto LAB_00104848;
      }
      sVar2 = sVar2 - 1;
      state->pos = sVar2;
    } while (sVar2 != 0);
  }
  goto LAB_00104858;
  while( true ) {
    sVar2 = sVar2 - 1;
    state->pos = sVar2;
    if (sVar2 == 0) break;
LAB_00104848:
    if (pcVar1[sVar2 - 1] == ' ') goto LAB_0010485a;
  }
LAB_00104858:
  sVar2 = 0;
LAB_0010485a:
  std::__cxx11::string::erase((ulong)state,sVar2);
  refreshLine(this,state);
  return;
}

Assistant:

void editDeletePreviousWord(State *state) {
		const size_t old_pos = state->pos;

		while (state->pos > 0 && state->buf[state->pos - 1] == ' ')
			state->pos--;

		while (state->pos > 0 && state->buf[state->pos - 1] != ' ')
			state->pos--;

		const size_t diff = old_pos - state->pos;
		state->buf.erase(state->pos, diff);
		refreshLine(state);
	}